

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O1

CcsDomain * __thiscall
ccs::CcsDomain::loadCcsStream
          (CcsDomain *this,istream *stream,string *fileName,ImportResolver *importResolver)

{
  _Head_base<0UL,_ccs::DagBuilder_*,_false> _Var1;
  undefined8 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  Loader loader;
  Loader local_28;
  
  _Var1._M_head_impl =
       (this->dag)._M_t.
       super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>._M_t.
       super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
       super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl;
  puVar2 = *(undefined8 **)
            &((_Var1._M_head_impl)->root_).super___shared_ptr<ccs::Node,_(__gnu_cxx::_Lock_policy)2>
  ;
  this_00._M_pi =
       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var1._M_head_impl)->root_ + 8))->
       _M_pi;
  if (this_00._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_28.trace = (CcsTracer *)*puVar2;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
    }
    local_28.trace = (CcsTracer *)*puVar2;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
  }
  Loader::loadCcsStream
            (&local_28,stream,fileName,
             (this->dag)._M_t.
             super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>._M_t.
             super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
             super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl,importResolver);
  return this;
}

Assistant:

CcsDomain &CcsDomain::loadCcsStream(std::istream &stream,
    const std::string &fileName, ImportResolver &importResolver) {
  Loader loader(dag->root()->tracer());
  loader.loadCcsStream(stream, fileName, *dag, importResolver);
  return *this;
}